

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O0

CURLcode smtp_perform_rcpt_to(Curl_easy *data)

{
  connectdata *pcVar1;
  SMTP *pSVar2;
  undefined1 local_58 [8];
  hostname host;
  char *address;
  SMTP *smtp;
  connectdata *conn;
  CURLcode result;
  Curl_easy *data_local;
  
  pcVar1 = data->conn;
  pSVar2 = (data->req).p.smtp;
  host.dispname = (char *)0x0;
  memset(local_58,0,0x20);
  data_local._4_4_ = smtp_parse_address(data,pSVar2->rcpt->data,&host.dispname,(hostname *)local_58)
  ;
  if (data_local._4_4_ == CURLE_OK) {
    if (host.encalloc == (char *)0x0) {
      conn._4_4_ = Curl_pp_sendf(data,&(pcVar1->proto).ftpc.pp,"RCPT TO:<%s>",host.dispname);
    }
    else {
      conn._4_4_ = Curl_pp_sendf(data,&(pcVar1->proto).ftpc.pp,"RCPT TO:<%s@%s>",host.dispname,
                                 host.encalloc);
    }
    Curl_free_idnconverted_hostname((hostname *)local_58);
    (*Curl_cfree)(host.dispname);
    if (conn._4_4_ == CURLE_OK) {
      state(data,SMTP_RCPT);
    }
    data_local._4_4_ = conn._4_4_;
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode smtp_perform_rcpt_to(struct Curl_easy *data)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;
  struct SMTP *smtp = data->req.p.smtp;
  char *address = NULL;
  struct hostname host = { NULL, NULL, NULL, NULL };

  /* Parse the recipient mailbox into the local address and host name parts,
     converting the host name to an IDN A-label if necessary */
  result = smtp_parse_address(data, smtp->rcpt->data,
                              &address, &host);
  if(result)
    return result;

  /* Send the RCPT TO command */
  if(host.name)
    result = Curl_pp_sendf(data, &conn->proto.smtpc.pp, "RCPT TO:<%s@%s>",
                           address, host.name);
  else
    /* An invalid mailbox was provided but we'll simply let the server worry
       about that and reply with a 501 error */
    result = Curl_pp_sendf(data, &conn->proto.smtpc.pp, "RCPT TO:<%s>",
                           address);

  Curl_free_idnconverted_hostname(&host);
  free(address);

  if(!result)
    state(data, SMTP_RCPT);

  return result;
}